

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O3

void gen_set_nzcv(TCGContext_conflict1 *tcg_ctx,TCGv_i64 tcg_rt)

{
  TCGTemp *ts;
  TCGv_i32 ret;
  
  ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)ts - (long)tcg_ctx);
  tcg_gen_extrl_i64_i32_aarch64(tcg_ctx,ret,tcg_rt);
  tcg_gen_andi_i32_aarch64(tcg_ctx,tcg_ctx->cpu_NF,ret,-0x80000000);
  tcg_gen_andi_i32_aarch64(tcg_ctx,tcg_ctx->cpu_ZF,ret,0x40000000);
  tcg_gen_setcondi_i32_aarch64(tcg_ctx,TCG_COND_EQ,tcg_ctx->cpu_ZF,tcg_ctx->cpu_ZF,0);
  tcg_gen_andi_i32_aarch64(tcg_ctx,tcg_ctx->cpu_CF,ret,0x20000000);
  tcg_gen_shri_i32_aarch64(tcg_ctx,tcg_ctx->cpu_CF,tcg_ctx->cpu_CF,0x1d);
  tcg_gen_andi_i32_aarch64(tcg_ctx,tcg_ctx->cpu_VF,ret,0x10000000);
  tcg_gen_shli_i32_aarch64(tcg_ctx,tcg_ctx->cpu_VF,tcg_ctx->cpu_VF,3);
  tcg_temp_free_internal_aarch64(tcg_ctx,ts);
  return;
}

Assistant:

static void gen_set_nzcv(TCGContext *tcg_ctx, TCGv_i64 tcg_rt)
{
    TCGv_i32 nzcv = tcg_temp_new_i32(tcg_ctx);

    /* take NZCV from R[t] */
    tcg_gen_extrl_i64_i32(tcg_ctx, nzcv, tcg_rt);

    /* bit 31, N */
    tcg_gen_andi_i32(tcg_ctx, tcg_ctx->cpu_NF, nzcv, (1U << 31));
    /* bit 30, Z */
    tcg_gen_andi_i32(tcg_ctx, tcg_ctx->cpu_ZF, nzcv, (1 << 30));
    tcg_gen_setcondi_i32(tcg_ctx, TCG_COND_EQ, tcg_ctx->cpu_ZF, tcg_ctx->cpu_ZF, 0);
    /* bit 29, C */
    tcg_gen_andi_i32(tcg_ctx, tcg_ctx->cpu_CF, nzcv, (1 << 29));
    tcg_gen_shri_i32(tcg_ctx, tcg_ctx->cpu_CF, tcg_ctx->cpu_CF, 29);
    /* bit 28, V */
    tcg_gen_andi_i32(tcg_ctx, tcg_ctx->cpu_VF, nzcv, (1 << 28));
    tcg_gen_shli_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_VF, 3);
    tcg_temp_free_i32(tcg_ctx, nzcv);
}